

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void * parse_bit_move(Parser *parser)

{
  Kind KVar1;
  Token *op;
  BinaryExpr *left;
  void *right;
  
  left = (BinaryExpr *)parse_add_sub(parser);
  KVar1 = parser->token->kind;
  while (KVar1 - LE2 < 2) {
    op = parser->token;
    move(parser);
    right = parse_add_sub(parser);
    left = new_binary_expr(left,op,right);
    KVar1 = op->kind;
  }
  return left;
}

Assistant:

void *parse_bit_move(Parser *parser) {
    void *left = parse_add_sub(parser);
    Token *tok = token(parser);
    while (g_kind(tok) == LE2 || g_kind(tok) == BIG2) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_add_sub(parser));
    }
    return left;
}